

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# align_widget.cxx
# Opt level: O1

void widget_size_cb(Fl_Widget *param_1,long size)

{
  Fl_Type *this;
  bool bVar1;
  int iVar2;
  Fl_Window *pFVar3;
  Fl_Type *pFVar4;
  int s;
  Fl_Color c;
  Fl_Font f;
  Fl_Fontsize local_3c;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar1 = false;
    pFVar4 = Fl_Type::first;
    do {
      if (pFVar4->selected != '\0') {
        iVar2 = (*pFVar4->_vptr_Fl_Type[0x17])(pFVar4);
        if (iVar2 != 0) {
          if (!bVar1) {
            set_modflag(1);
            undo_checkpoint();
          }
          this = pFVar4[1].prev;
          local_3c = (Fl_Fontsize)size;
          *(Fl_Fontsize *)&this->field_0x4c = local_3c;
          (*pFVar4->_vptr_Fl_Type[0x2b])(pFVar4,2,local_34,&local_3c,local_38);
          Fl_Widget::redraw((Fl_Widget *)this);
          pFVar3 = Fl_Widget::window((Fl_Widget *)this);
          if (pFVar3 != (Fl_Window *)0x0) {
            pFVar3 = Fl_Widget::window((Fl_Widget *)this);
            Fl_Widget::redraw((Fl_Widget *)pFVar3);
          }
          bVar1 = true;
        }
      }
      pFVar4 = pFVar4->next;
    } while (pFVar4 != (Fl_Type *)0x0);
  }
  return;
}

Assistant:

void widget_size_cb(Fl_Widget *, long size) {
  // Update any selected widgets...
  int changed = 0;
  for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
    if (o->selected && o->is_widget()) {
      if (!changed) {
	changed = 1;
	set_modflag(1);
	undo_checkpoint();
      }

      Fl_Widget *w = ((Fl_Widget_Type *)o)->o;
      w->labelsize((Fl_Font)size);
      Fl_Font f;
      int s = (int)size;
      Fl_Color c;
      ((Fl_Widget_Type *)o)->textstuff(2, f, s, c);

      w->redraw();
      // since this may be a major change, the whole window should be redrawn
      if (w->window()) w->window()->redraw();
    }
  }
}